

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrEvaluationTest.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  double dVar1;
  byte bVar2;
  Variable y;
  Variable x;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  Variable *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined7 in_stack_fffffffffffffe00;
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [36];
  undefined4 local_184;
  string local_168 [24];
  Variable *in_stack_fffffffffffffeb0;
  Variable *in_stack_fffffffffffffeb8;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [132];
  int local_4;
  
  local_4 = 0;
  Kandinsky::Variable::Variable((Variable *)0x1124ae);
  Kandinsky::Variable::Variable((Variable *)0x1124bb);
  Kandinsky::Variable::setValue
            (in_stack_fffffffffffffdd0,
             (double)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
  Kandinsky::Variable::setValue
            (in_stack_fffffffffffffdd0,
             (double)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
  Kandinsky::operator||<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  dVar1 = Kandinsky::Expression::evaluate((Expression *)0x112512);
  bVar2 = -(dVar1 == 1.0) & 1;
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Kandinsky::Variable::evaluate((Variable *)0x112546);
  std::__cxx11::to_string((double)in_stack_fffffffffffffdd8);
  std::operator+(in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0);
  Kandinsky::Variable::evaluate((Variable *)0x11258e);
  std::__cxx11::to_string((double)in_stack_fffffffffffffdd8);
  std::operator+(pbVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(bVar2,in_stack_fffffffffffffe00));
  std::operator+(in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0);
  Kandinsky::assertOrExit
            (SUB81((ulong)in_stack_fffffffffffffdd0 >> 0x38,0),
             (string *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_e8);
  Kandinsky::Expression::~Expression((Expression *)0x11264f);
  Kandinsky::operator||<Kandinsky::Variable,_int,_nullptr>
            (in_stack_fffffffffffffeb8,(int *)in_stack_fffffffffffffeb0);
  Kandinsky::Expression::evaluate((Expression *)0x112686);
  Kandinsky::Variable::evaluate((Variable *)0x1126ba);
  std::__cxx11::to_string((double)in_stack_fffffffffffffdd8);
  std::operator+(in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0);
  Kandinsky::assertOrExit
            (SUB81((ulong)in_stack_fffffffffffffdd0 >> 0x38,0),
             (string *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
  std::__cxx11::string::~string(local_168);
  Kandinsky::Expression::~Expression((Expression *)0x112735);
  local_184 = 0;
  Kandinsky::operator||<int,_Kandinsky::Variable,_nullptr>
            ((int *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Kandinsky::Expression::evaluate((Expression *)0x11276c);
  bVar2 = -((double)pbVar3 == 0.0) & 1;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          Kandinsky::Variable::evaluate((Variable *)0x11279b);
  std::__cxx11::to_string((double)pbVar3);
  std::operator+((char *)pbVar3,__rhs);
  std::operator+(pbVar3,(char *)__rhs);
  Kandinsky::assertOrExit
            (SUB81((ulong)__rhs >> 0x38,0),(string *)CONCAT17(bVar2,in_stack_fffffffffffffdc8));
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::~string(local_1e8);
  Kandinsky::Expression::~Expression((Expression *)0x11282f);
  local_4 = 0;
  Kandinsky::Variable::~Variable((Variable *)0x112847);
  Kandinsky::Variable::~Variable((Variable *)0x112854);
  return local_4;
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    Variable y;
    x.setValue(3);
    y.setValue(0);
    assertOrExit((x || y).evaluate() == 1, std::to_string(x.evaluate()) + " || " + std::to_string(y.evaluate()) + " != 1");
    assertOrExit((x || 1).evaluate() == 1, std::to_string(x.evaluate()) + " || 1 != 1");
    assertOrExit((0 || y).evaluate() == 0, "0 || " + std::to_string(y.evaluate()) + " != 0");
    return 0;
}